

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderSubroutineTests.cpp
# Opt level: O2

void __thiscall
gl4cts::ShaderSubroutine::NegativeTest2::executeTestCase
          (NegativeTest2 *this,_shader_stage *referencing_stage)

{
  ostringstream *this_00;
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  string vs_body;
  string te_body;
  string tc_body;
  string gs_body;
  string fs_body;
  undefined1 local_1b0 [384];
  
  iVar2 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  getFragmentShaderBody_abi_cxx11_(&fs_body,this,referencing_stage);
  getGeometryShaderBody_abi_cxx11_(&gs_body,this,referencing_stage);
  getTessellationControlShaderBody_abi_cxx11_(&tc_body,this,referencing_stage);
  getTessellationEvaluationShaderBody_abi_cxx11_(&te_body,this,referencing_stage);
  getVertexShaderBody_abi_cxx11_(&vs_body,this,referencing_stage);
  local_1b0._0_8_ = (ulong)(uint)local_1b0._4_4_ << 0x20;
  bVar1 = Utils::buildProgram((Functions *)CONCAT44(extraout_var,iVar2),&vs_body,&tc_body,&te_body,
                              &gs_body,&fs_body,(GLchar **)0x0,(uint *)local_1b0,&this->m_vs_id,
                              &this->m_tc_id,&this->m_te_id,&this->m_gs_id,&this->m_fs_id,
                              &this->m_po_id);
  if (bVar1) {
    local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    this_00 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(this_00);
    std::operator<<((ostream *)this_00,
                    "In the following program, one of the stages references a subroutine that is defined in another stage. This is forbidden by the specification.\n\nVertex shader:\n\n"
                   );
    std::operator<<((ostream *)this_00,vs_body._M_dataplus._M_p);
    std::operator<<((ostream *)this_00,"\n\nTessellation control shader:\n\n");
    std::operator<<((ostream *)this_00,tc_body._M_dataplus._M_p);
    std::operator<<((ostream *)this_00,"\n\nTessellation evaluation shader:\n\n");
    std::operator<<((ostream *)this_00,te_body._M_dataplus._M_p);
    std::operator<<((ostream *)this_00,"\n\nGeometry shader:\n\n");
    std::operator<<((ostream *)this_00,gs_body._M_dataplus._M_p);
    std::operator<<((ostream *)this_00,"\n\nFragment shader:\n\n");
    std::operator<<((ostream *)this_00,fs_body._M_dataplus._M_p);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(this_00);
    this->m_has_test_passed = false;
  }
  deinitGLObjects(this);
  std::__cxx11::string::~string((string *)&vs_body);
  std::__cxx11::string::~string((string *)&te_body);
  std::__cxx11::string::~string((string *)&tc_body);
  std::__cxx11::string::~string((string *)&gs_body);
  std::__cxx11::string::~string((string *)&fs_body);
  return;
}

Assistant:

void NegativeTest2::executeTestCase(const Utils::_shader_stage& referencing_stage)
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	const std::string fs_body = getFragmentShaderBody(referencing_stage);
	const std::string gs_body = getGeometryShaderBody(referencing_stage);
	const std::string tc_body = getTessellationControlShaderBody(referencing_stage);
	const std::string te_body = getTessellationEvaluationShaderBody(referencing_stage);
	const std::string vs_body = getVertexShaderBody(referencing_stage);

	if (Utils::buildProgram(gl, vs_body, tc_body, te_body, gs_body, fs_body, NULL, /* xfb_varyings */
							0,													   /* n_xfb_varyings */
							&m_vs_id, &m_tc_id, &m_te_id, &m_gs_id, &m_fs_id, &m_po_id))
	{
		/* Test program should not have built correctly ! */
		m_testCtx.getLog() << tcu::TestLog::Message << "In the following program, one of the stages references "
													   "a subroutine that is defined in another stage. This "
													   "is forbidden by the specification.\n"
													   "\n"
													   "Vertex shader:\n\n"
						   << vs_body.c_str() << "\n\nTessellation control shader:\n\n"
						   << tc_body.c_str() << "\n\nTessellation evaluation shader:\n\n"
						   << te_body.c_str() << "\n\nGeometry shader:\n\n"
						   << gs_body.c_str() << "\n\nFragment shader:\n\n"
						   << fs_body.c_str() << tcu::TestLog::EndMessage;

		m_has_test_passed = false;
	} /* if (test program was built successfully) */

	/* Release the shaders & the program object that buildProgram() created */
	deinitGLObjects();
}